

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O0

LispPTR releasingvmempage(LispPTR ptr)

{
  LispPTR LAddr;
  LispPTR *pLVar1;
  LispPTR bufferptr;
  buf *bptr;
  LispPTR ptr_local;
  
  LAddr = findptrsbuffer(ptr);
  if (LAddr == 0) {
    bptr._4_4_ = 0;
  }
  else {
    pLVar1 = NativeAligned4FromLAddr(LAddr);
    pLVar1[3] = pLVar1[3] & 0x7fffffff | 0x80000000;
    bptr._4_4_ = 0x4c;
  }
  return bptr._4_4_;
}

Assistant:

LispPTR releasingvmempage(LispPTR ptr) {
  struct buf *bptr;
  LispPTR bufferptr = findptrsbuffer(ptr);

  if (bufferptr == NIL) return (NIL); /* Not in use, OK to reclaim it */

  bptr = (struct buf *)NativeAligned4FromLAddr(bufferptr);
  bptr->noreference = T; /* Mark the buffer free to use ?? */
  return (ATOM_T);
}